

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_readfile(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  int iVar2;
  jx9_io_stream *pStream;
  void *pvVar3;
  jx9_int64 jVar4;
  char *pcVar5;
  long iValue;
  jx9_value *pResource;
  jx9_vm *pVm;
  char *zFile;
  int nLen;
  char zBuf [8192];
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pcVar5 = "Expecting a file path";
  }
  else {
    zFile = jx9_value_to_string(*apArg,&nLen);
    pVm = pCtx->pVm;
    pStream = jx9VmGetStreamDevice(pVm,&zFile,nLen);
    if (pStream != (jx9_io_stream *)0x0) {
      if (nArg == 1) {
        iVar2 = 0;
LAB_001358cd:
        pResource = (jx9_value *)0x0;
      }
      else {
        iVar2 = jx9_value_to_bool(apArg[1]);
        pVm = pCtx->pVm;
        if ((uint)nArg < 3) goto LAB_001358cd;
        pResource = apArg[2];
      }
      pcVar5 = zFile;
      pvVar3 = jx9StreamOpenHandle(pVm,pStream,zFile,1,iVar2,pResource,0,(int *)0x0);
      if (pvVar3 != (void *)0x0) {
        lVar1 = 0;
        do {
          iValue = lVar1;
          jVar4 = (*pStream->xRead)(pvVar3,zBuf,0x2000);
          if (jVar4 < 1) break;
          iVar2 = jx9_context_output(pCtx,zBuf,(int)jVar4);
          lVar1 = jVar4 + iValue;
        } while (iVar2 != -10);
        if (pStream->xClose != (_func_void_void_ptr *)0x0) {
          (*pStream->xClose)(pvVar3);
        }
        jx9_result_int64(pCtx,iValue);
        return 0;
      }
      jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",pcVar5);
      goto LAB_0013584b;
    }
    pcVar5 = "No such stream device, JX9 is returning FALSE";
  }
  jx9_context_throw_error(pCtx,2,pcVar5);
LAB_0013584b:
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_readfile(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int use_include  = FALSE;
	const jx9_io_stream *pStream;
	jx9_int64 n, nRead;
	const char *zFile;
	char zBuf[8192];
	void *pHandle;
	int rc, nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 1 ){
		use_include = jx9_value_to_bool(apArg[1]);
	}
	/* Try to open the file in read-only mode */
	pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, JX9_IO_OPEN_RDONLY, 
		use_include, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	nRead = 0;
	for(;;){
		n = pStream->xRead(pHandle, zBuf, sizeof(zBuf));
		if( n < 1 ){
			/* EOF or IO error, break immediately */
			break;
		}
		/* Output data */
		rc = jx9_context_output(pCtx, zBuf, (int)n);
		if( rc == JX9_ABORT ){
			break;
		}
		/* Increment counter */
		nRead += n;
	}
	/* Close the stream */
	jx9StreamCloseHandle(pStream, pHandle);
	/* Total number of bytes readen */
	jx9_result_int64(pCtx, nRead);
	return JX9_OK;
}